

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall
QRenderRule::drawBackgroundImage(QRenderRule *this,QPainter *p,QRect *rect,QPoint off)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  QStyleSheetBackgroundData *pQVar7;
  QPainter *in_RSI;
  long in_FS_OFFSET;
  int bgpWidth;
  int bgpHeight;
  QPixmap *bgp;
  QRect inter;
  QRect aligned;
  QRect r;
  QSize bgpSize;
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  int in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  QPainter *in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  Origin OVar8;
  int in_stack_fffffffffffffe18;
  Origin in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  QRenderRule *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  QRect *in_stack_fffffffffffffe38;
  LayoutDirection in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe68;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe88;
  QRect local_30;
  QRect local_20;
  long local_8;
  
  alignment.i = (Int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = hasBackground((QRenderRule *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
                       );
  if (bVar1) {
    background((QRenderRule *)0x424229);
    uVar6 = QPixmap::isNull();
    if ((uVar6 & 1) == 0) {
      local_20 = borderRect((QRenderRule *)
                            CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                            (QRect *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      setClip((QRenderRule *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
              in_stack_fffffffffffffe08,
              (QRect *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      pQVar7 = background((QRenderRule *)0x4242ac);
      OVar8 = pQVar7->origin;
      pQVar7 = background((QRenderRule *)0x4242c3);
      if (OVar8 != pQVar7->clip) {
        QPainter::save();
        background((QRenderRule *)0x42430c);
        local_30 = originRect(in_stack_fffffffffffffe28,
                              (QRect *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                              ,in_stack_fffffffffffffe1c);
        QPainter::setClipRect((QRect *)in_RSI,(ClipOperation)&local_30);
      }
      pQVar7 = background((QRenderRule *)0x42435b);
      if (pQVar7->attachment == Attachment_Fixed) {
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
      }
      QPixmap::size();
      QPixmap::devicePixelRatio();
      operator/((QSize *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                (qreal)in_stack_fffffffffffffe08);
      iVar2 = QSize::height((QSize *)0x4243e0);
      iVar3 = QSize::width((QSize *)0x4243f4);
      background((QRenderRule *)0x424427);
      originRect(in_stack_fffffffffffffe28,
                 (QRect *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe1c);
      background((QRenderRule *)0x42446b);
      QStyle::alignedRect(in_stack_fffffffffffffe40,(Alignment)alignment.i,
                          (QSize *)in_stack_fffffffffffffe38,
                          (QRect *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      ::operator-((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      QRect::translated(in_stack_fffffffffffffe38,
                        (QPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      QRect::intersected((QRect *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                         (QRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      pQVar7 = background((QRenderRule *)0x424526);
      switch(pQVar7->repeat) {
      case Repeat_None:
      default:
        QRect::x((QRect *)0x42495e);
        QRect::y((QRect *)0x42496f);
        iVar2 = QRect::x((QRect *)0x42498d);
        iVar3 = QRect::x((QRect *)0x42499e);
        iVar3 = iVar2 - iVar3;
        QPoint::x((QPoint *)0x4249b7);
        iVar4 = QRect::y((QRect *)0x4249d0);
        iVar5 = QRect::y((QRect *)0x4249e1);
        iVar5 = iVar4 - iVar5;
        QPoint::y((QPoint *)0x4249fa);
        in_stack_fffffffffffffdf8 = QPixmap::width();
        in_stack_fffffffffffffe00 = QPixmap::height();
        QPainter::drawPixmap
                  (in_RSI,iVar5,iVar4,(QPixmap *)CONCAT44(iVar3,iVar2),in_stack_fffffffffffffe14,
                   in_stack_fffffffffffffe10,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
        break;
      case Repeat_X:
        QRect::x((QRect *)0x4246e9);
        QRect::y((QRect *)0x4246fd);
        QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        iVar2 = QRect::x((QRect *)0x424757);
        iVar4 = QRect::x((QRect *)0x42476b);
        iVar3 = iVar3 - (iVar2 - iVar4) % iVar3;
        in_stack_fffffffffffffdf8 = QPoint::x((QPoint *)0x42479b);
        in_stack_fffffffffffffdf8 = iVar3 + in_stack_fffffffffffffdf8;
        iVar3 = QRect::y((QRect *)0x4247ba);
        iVar4 = QRect::y((QRect *)0x4247ce);
        in_stack_fffffffffffffe00 = QPoint::y((QPoint *)0x4247ed);
        in_stack_fffffffffffffe00 = (iVar3 - iVar4) + in_stack_fffffffffffffe00;
        QPainter::drawTiledPixmap
                  ((QPainter *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                   in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,
                   (QPixmap *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   in_stack_fffffffffffffe70,iVar2);
        break;
      case Repeat_Y:
        QRect::x((QRect *)0x424574);
        QRect::y((QRect *)0x424588);
        QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        iVar3 = QRect::x((QRect *)0x4245d4);
        iVar4 = QRect::x((QRect *)0x4245e8);
        in_stack_fffffffffffffdf8 = QPoint::x((QPoint *)0x424607);
        in_stack_fffffffffffffdf8 = (iVar3 - iVar4) + in_stack_fffffffffffffdf8;
        iVar3 = QRect::y((QRect *)0x424634);
        iVar4 = QRect::y((QRect *)0x424648);
        in_stack_fffffffffffffe00 = QPoint::y((QPoint *)0x424678);
        in_stack_fffffffffffffe00 = (iVar2 - (iVar3 - iVar4) % iVar2) + in_stack_fffffffffffffe00;
        QPainter::drawTiledPixmap
                  ((QPainter *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                   in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,
                   (QPixmap *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
        break;
      case Repeat_XY:
        QRect::x((QRect *)0x424873);
        QRect::x((QRect *)0x424884);
        QPoint::x((QPoint *)0x4248ab);
        QRect::y((QRect *)0x4248cf);
        QRect::y((QRect *)0x4248e0);
        QPoint::y((QPoint *)0x424907);
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
        QPainter::drawTiledPixmap
                  ((QPainter *)in_stack_fffffffffffffe28,
                   (QRect *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (QPixmap *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   (QPoint *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      }
      pQVar7 = background((QRenderRule *)0x424a5f);
      OVar8 = pQVar7->origin;
      pQVar7 = background((QRenderRule *)0x424a73);
      if (OVar8 != pQVar7->clip) {
        QPainter::restore();
      }
      unsetClip((QRenderRule *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                (QPainter *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRenderRule::drawBackgroundImage(QPainter *p, const QRect &rect, QPoint off)
{
    if (!hasBackground())
        return;

    const QPixmap& bgp = background()->pixmap;
    if (bgp.isNull())
        return;

    setClip(p, borderRect(rect));

    if (background()->origin != background()->clip) {
        p->save();
        p->setClipRect(originRect(rect, background()->clip), Qt::IntersectClip);
    }

    if (background()->attachment == Attachment_Fixed)
        off = QPoint(0, 0);

    QSize bgpSize = bgp.size() / bgp.devicePixelRatio();
    int bgpHeight = bgpSize.height();
    int bgpWidth = bgpSize.width();
    QRect r = originRect(rect, background()->origin);
    QRect aligned = QStyle::alignedRect(Qt::LeftToRight, background()->position, bgpSize, r);
    QRect inter = aligned.translated(-off).intersected(r);

    switch (background()->repeat) {
    case Repeat_Y:
        p->drawTiledPixmap(inter.x(), r.y(), inter.width(), r.height(), bgp,
                           inter.x() - aligned.x() + off.x(),
                           bgpHeight - int(aligned.y() - r.y()) % bgpHeight + off.y());
        break;
    case Repeat_X:
        p->drawTiledPixmap(r.x(), inter.y(), r.width(), inter.height(), bgp,
                           bgpWidth - int(aligned.x() - r.x())%bgpWidth + off.x(),
                           inter.y() - aligned.y() + off.y());
        break;
    case Repeat_XY:
        p->drawTiledPixmap(r, bgp,
                            QPoint(bgpWidth - int(aligned.x() - r.x())% bgpWidth + off.x(),
                                   bgpHeight - int(aligned.y() - r.y())%bgpHeight + off.y()));
        break;
    case Repeat_None:
    default:
        p->drawPixmap(inter.x(), inter.y(), bgp, inter.x() - aligned.x() + off.x(),
                      inter.y() - aligned.y() + off.y(), bgp.width() , bgp.height());
        break;
    }


    if (background()->origin != background()->clip)
        p->restore();

    unsetClip(p);
}